

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

void do_cmd_wiz_tweak_item(command *cmd)

{
  bitflag bVar1;
  uint16_t uVar2;
  object *poVar3;
  loc lVar4;
  _Bool _Var5;
  _Bool _Var6;
  wchar_t wVar7;
  ego_item *peVar8;
  artifact *art;
  ego_item *e;
  long lVar9;
  char **ppcVar10;
  object *obj;
  wchar_t val;
  wchar_t update;
  char tmp_val [80];
  char prompt [80];
  object *local_f8;
  int local_f0;
  int local_ec;
  object *local_e8;
  object *poStack_e0;
  char local_d8 [80];
  char local_88 [88];
  
  local_ec = 0;
  wVar7 = cmd_get_arg_item((command_conflict *)cmd,"item",&local_f8);
  if (wVar7 != L'\0') {
    _Var5 = get_item(&local_f8,"Tweak which item? ","You have nothing to tweak.",cmd->code,
                     (item_tester)0x0,L'\x0f');
    if (!_Var5) {
      return;
    }
    cmd_set_arg_item((command_conflict *)cmd,"item",local_f8);
  }
  if (local_f8->artifact == (artifact *)0x0) {
    wVar7 = cmd_get_arg_choice((command_conflict *)cmd,"update",&local_ec);
    if (wVar7 != L'\0') {
      local_ec = 1;
    }
    if (local_f8->ego == (ego_item *)0x0) {
      strnfmt(local_d8,0x50,"-1");
    }
    else {
      strnfmt(local_d8,0x50,"%s",local_f8->ego->name);
    }
    _Var5 = get_string("Enter ego item: ",local_d8,0x50);
    if (_Var5) {
      _Var5 = get_int_from_string(local_d8,&local_f0);
      if (_Var5) {
        if (((long)local_f0 < 0) || ((int)(uint)z_info->e_max <= local_f0)) {
          peVar8 = (ego_item *)0x0;
        }
        else {
          peVar8 = e_info + local_f0;
        }
      }
      else {
        peVar8 = lookup_ego_item(local_d8,(uint)local_f8->tval,(uint)local_f8->sval);
      }
      local_f8->ego = peVar8;
      if (peVar8 != (ego_item *)0x0) {
        local_e8 = local_f8->prev;
        poStack_e0 = local_f8->next;
        poVar3 = local_f8->known;
        uVar2 = local_f8->oidx;
        lVar4 = local_f8->grid;
        bVar1 = local_f8->notice;
        object_prep(local_f8,local_f8->kind,(int)player->depth,RANDOMISE);
        local_f8->ego = peVar8;
        local_f8->prev = local_e8;
        local_f8->next = poStack_e0;
        local_f8->known = poVar3;
        local_f8->oidx = uVar2;
        local_f8->grid = lVar4;
        local_f8->notice = bVar1;
        ego_apply_magic(local_f8,(int)player->depth,RANDOMISE);
      }
      wiz_display_item(local_f8,true,player);
      if (local_f8->artifact == (artifact *)0x0) {
        strnfmt(local_d8,0x50,"0");
      }
      else {
        strnfmt(local_d8,0x50,"%s",local_f8->artifact->name);
      }
      _Var5 = get_string("Enter new artifact: ",local_d8,0x50);
      if (_Var5) {
        _Var5 = get_int_from_string(local_d8,&local_f0);
        if (_Var5) {
          if (((long)local_f0 < 1) || ((int)(uint)z_info->a_max <= local_f0)) {
            art = (artifact *)0x0;
          }
          else {
            art = a_info + local_f0;
          }
        }
        else {
          art = lookup_artifact_name(local_d8);
        }
        local_f8->artifact = art;
        if (art != (artifact *)0x0) {
          local_e8 = local_f8->prev;
          poStack_e0 = local_f8->next;
          poVar3 = local_f8->known;
          uVar2 = local_f8->oidx;
          lVar4 = local_f8->grid;
          bVar1 = local_f8->notice;
          local_f8->ego = (ego_item *)0x0;
          object_prep(local_f8,local_f8->kind,art->alloc_min,RANDOMISE);
          local_f8->artifact = art;
          local_f8->prev = local_e8;
          local_f8->next = poStack_e0;
          local_f8->known = poVar3;
          local_f8->oidx = uVar2;
          local_f8->grid = lVar4;
          local_f8->notice = bVar1;
          copy_artifact_data(local_f8,art);
        }
        wiz_display_item(local_f8,true,player);
        ppcVar10 = do_cmd_wiz_tweak_item::obj_mods;
        lVar9 = 0;
        do {
          strnfmt(local_88,0x50,"Enter new %s setting: ",*ppcVar10);
          strnfmt(local_d8,0x50,"%d",(ulong)(uint)(int)local_f8->modifiers[lVar9]);
          _Var5 = get_string(local_88,local_d8,0x50);
          if (_Var5) {
            _Var6 = get_int_from_string(local_d8,&local_f0);
            if (_Var6) {
              local_f8->modifiers[lVar9] = (int16_t)local_f0;
              wiz_display_item(local_f8,true,player);
            }
          }
          else if (local_ec == 0) {
            wiz_play_item_notify_changed();
          }
          else {
            wiz_play_item_standard_upkeep(player,local_f8);
          }
          if (!_Var5) {
            return;
          }
          lVar9 = lVar9 + 1;
          ppcVar10 = ppcVar10 + 1;
        } while (lVar9 != 0x11);
        strnfmt(local_88,0x50,"Enter new %s setting: ","AC bonus");
        strnfmt(local_d8,0x50,"%d",(ulong)(uint)(int)local_f8->to_a);
        _Var5 = get_string(local_88,local_d8,0x50);
        if (_Var5) {
          _Var6 = get_int_from_string(local_d8,&local_f0);
          if (_Var6) {
            local_f8->to_a = (int16_t)local_f0;
            wiz_display_item(local_f8,true,player);
          }
        }
        else if (local_ec == 0) {
          wiz_play_item_notify_changed();
        }
        else {
          wiz_play_item_standard_upkeep(player,local_f8);
        }
        if (!_Var5) {
          return;
        }
        strnfmt(local_88,0x50,"Enter new %s setting: ","to-hit");
        strnfmt(local_d8,0x50,"%d",(ulong)(uint)(int)local_f8->to_h);
        _Var5 = get_string(local_88,local_d8,0x50);
        if (_Var5) {
          _Var6 = get_int_from_string(local_d8,&local_f0);
          if (_Var6) {
            local_f8->to_h = (int16_t)local_f0;
            wiz_display_item(local_f8,true,player);
          }
        }
        else if (local_ec == 0) {
          wiz_play_item_notify_changed();
        }
        else {
          wiz_play_item_standard_upkeep(player,local_f8);
        }
        if (!_Var5) {
          return;
        }
        strnfmt(local_88,0x50,"Enter new %s setting: ","to-dam");
        strnfmt(local_d8,0x50,"%d",(ulong)(uint)(int)local_f8->to_d);
        _Var5 = get_string(local_88,local_d8,0x50);
        if (_Var5) {
          _Var6 = get_int_from_string(local_d8,&local_f0);
          if (_Var6) {
            local_f8->to_d = (int16_t)local_f0;
            wiz_display_item(local_f8,true,player);
          }
        }
        else if (local_ec == 0) {
          wiz_play_item_notify_changed();
        }
        else {
          wiz_play_item_standard_upkeep(player,local_f8);
        }
        if (!_Var5) {
          return;
        }
      }
      if (local_ec == 0) {
        wiz_play_item_notify_changed();
      }
      else {
        wiz_play_item_standard_upkeep(player,local_f8);
      }
    }
  }
  return;
}

Assistant:

void do_cmd_wiz_tweak_item(struct command *cmd)
{
	static const char *obj_mods[] = {
		#define STAT(a) #a,
		#include "list-stats.h"
		#undef STAT
		#define OBJ_MOD(a) #a,
		#include "list-object-modifiers.h"
		#undef OBJ_MOD
		NULL
	};
	struct object *obj;
	char tmp_val[80];
	int i, val;
	int update = 0;

	/* Get the item to tweak. */
	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK) {
		if (!get_item(&obj, "Tweak which item? ",
				"You have nothing to tweak.", cmd->code,
				NULL, (USE_EQUIP | USE_INVEN | USE_QUIVER |
				USE_FLOOR))) {
			return;
		}
		cmd_set_arg_item(cmd, "item", obj);
	}

	/* Hack -- leave artifacts alone */
	if (obj->artifact) return;

	/*
	 * Check for whether updating the player information or let
	 * do_cmd_wiz_play_item() handle it.
	 */
	if (cmd_get_arg_choice(cmd, "update", &update) != CMD_OK) {
		update = 1;
	}

	/* Get ego name. */
	if (obj->ego) {
		strnfmt(tmp_val, sizeof(tmp_val), "%s", obj->ego->name);
	} else {
		strnfmt(tmp_val, sizeof(tmp_val), "-1");
	}
	if (!get_string("Enter ego item: ", tmp_val, sizeof(tmp_val))) return;

	/* Accept index or name */
	if (get_int_from_string(tmp_val, &val)) {
		if (val >= 0 && val < z_info->e_max) {
			obj->ego = &e_info[val];
		} else {
			obj->ego = NULL;
		}
	} else {
		obj->ego = lookup_ego_item(tmp_val, obj->tval, obj->sval);
	}
	if (obj->ego) {
		struct ego_item *e = obj->ego;
		struct object *prev = obj->prev;
		struct object *next = obj->next;
		struct object *known = obj->known;
		uint16_t oidx = obj->oidx;
		struct loc grid = obj->grid;
		bitflag notice = obj->notice;

		object_prep(obj, obj->kind, player->depth, RANDOMISE);
		obj->ego = e;
		obj->prev = prev;
		obj->next = next;
		obj->known = known;
		obj->oidx = oidx;
		obj->grid = grid;
		obj->notice = notice;
		ego_apply_magic(obj, player->depth, RANDOMISE);
	}
	wiz_display_item(obj, true, player);

	/* Get artifact name */
	if (obj->artifact) {
		strnfmt(tmp_val, sizeof(tmp_val), "%s", obj->artifact->name);
	} else {
		strnfmt(tmp_val, sizeof(tmp_val), "0");
	}
	if (!get_string("Enter new artifact: ", tmp_val, sizeof(tmp_val))) {
		if (update) {
			wiz_play_item_standard_upkeep(player, obj);
		} else {
			wiz_play_item_notify_changed();
		}
		return;
	}

	/* Accept index or name */
	if (get_int_from_string(tmp_val, &val)) {
		if (val > 0 && val < z_info->a_max) {
			obj->artifact = &a_info[val];
		} else {
			obj->artifact = NULL;
		}
	} else {
		obj->artifact = lookup_artifact_name(tmp_val);
	}
	if (obj->artifact) {
		const struct artifact *a = obj->artifact;
		struct object *prev = obj->prev;
		struct object *next = obj->next;
		struct object *known = obj->known;
		uint16_t oidx = obj->oidx;
		struct loc grid = obj->grid;
		bitflag notice = obj->notice;

		obj->ego = NULL;
		object_prep(obj, obj->kind, obj->artifact->alloc_min, RANDOMISE);
		obj->artifact = a;
		obj->prev = prev;
		obj->next = next;
		obj->known = known;
		obj->oidx = oidx;
		obj->grid = grid;
		obj->notice = notice;
		copy_artifact_data(obj, obj->artifact);
	}
	wiz_display_item(obj, true, player);

#define WIZ_TWEAK(attribute, name) do {\
		char prompt[80];\
		strnfmt(prompt, sizeof(prompt), "Enter new %s setting: ", name);\
		strnfmt(tmp_val, sizeof(tmp_val), "%d", obj->attribute);\
		if (!get_string(prompt, tmp_val, sizeof(tmp_val))) {\
			if (update) {\
				wiz_play_item_standard_upkeep(player, obj);\
			} else {\
				wiz_play_item_notify_changed();\
			}\
			return;\
		}\
		if (get_int_from_string(tmp_val, &val)) {\
			obj->attribute = val;\
			wiz_display_item(obj, true, player);\
		}\
} while (0)
	for (i = 0; i < OBJ_MOD_MAX; i++) {
		WIZ_TWEAK(modifiers[i], obj_mods[i]);
	}
	WIZ_TWEAK(to_a, "AC bonus");
	WIZ_TWEAK(to_h, "to-hit");
	WIZ_TWEAK(to_d, "to-dam");

	if (update) {
		wiz_play_item_standard_upkeep(player, obj);
	} else {
		wiz_play_item_notify_changed();
	}
}